

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O0

uint32_t __thiscall ExportEntryWrapper::getFuncNameId(ExportEntryWrapper *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator found;
  WORD ord;
  ExportEntryWrapper *this_local;
  
  if (this->parentDir == (ExportDirWrapper *)0x0) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    found._M_node._6_2_ = (undefined2)(this->super_ExeNodeWrapper).entryNum;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_unsigned_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
         ::find(&this->parentDir->ordToNameId,(key_type_conflict1 *)((long)&found._M_node + 6));
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_unsigned_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
         ::end(&this->parentDir->ordToNameId);
    bVar1 = std::operator==(&local_28,&local_30);
    if (bVar1) {
      this_local._4_4_ = 0xffffffff;
    }
    else {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_unsigned_int>_>::operator->
                         (&local_28);
      this_local._4_4_ = ppVar2->second;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t ExportEntryWrapper::getFuncNameId()
{
    if (this->parentDir == NULL) return INVALID_ID;

    WORD ord = static_cast<WORD>(this->entryNum);
    std::map<WORD, DWORD>::iterator found = parentDir->ordToNameId.find(ord);
    if (found == parentDir->ordToNameId.end()) {
        return INVALID_ID;
    }
    return found->second;
}